

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

void __thiscall cppcms::form::attach(form *this,base_widget *subform)

{
  pair<cppcms::base_form_*,_bool> local_20;
  
  local_20.second = true;
  local_20.first = &subform->super_base_form;
  std::vector<std::pair<cppcms::base_form*,bool>,std::allocator<std::pair<cppcms::base_form*,bool>>>
  ::emplace_back<std::pair<cppcms::base_form*,bool>>
            ((vector<std::pair<cppcms::base_form*,bool>,std::allocator<std::pair<cppcms::base_form*,bool>>>
              *)&this->elements_,&local_20);
  (*(subform->super_base_form)._vptr_base_form[4])(subform,this);
  return;
}

Assistant:

void form::attach(widgets::base_widget *subform)
{
	elements_.push_back(widget_type(subform,true));
	subform->parent(this);
}